

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall
QPDFWriter::unparseObject
          (QPDFWriter *this,QPDFObjectHandle *object,int level,int flags,size_t stream_length,
          bool compress)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar1;
  variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  *__v;
  uint uVar2;
  uint uVar3;
  char cVar4;
  bool bVar5;
  __index_type _Var6;
  qpdf_object_type_e qVar7;
  int iVar8;
  int iVar9;
  QPDFObjGen QVar10;
  uchar *key;
  Object *pOVar11;
  const_iterator cVar12;
  iterator iVar13;
  iterator iVar14;
  RC4_KEY *key_00;
  long *plVar15;
  QPDF_Dictionary *pQVar16;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar17;
  _Base_ptr p_Var18;
  element_type *peVar19;
  undefined8 *puVar20;
  QPDFObjGen *pQVar21;
  logic_error *this_01;
  byte bVar22;
  uint uVar23;
  undefined4 in_register_0000000c;
  uint *indata;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  size_t __n;
  QPDFObjGen __n_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  QPDFObjectHandle *__n_01;
  ulong uVar26;
  QPDFObjectHandle *pQVar27;
  uint uVar28;
  uint uVar29;
  char cVar30;
  ulong uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  undefined7 in_register_00000089;
  _Base_ptr p_Var34;
  bool bVar35;
  bool bVar36;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar37;
  string val;
  Pl_Buffer bufpl;
  RC4 rc4;
  Pl_AES_PDF pl;
  bool is_metadata;
  string indent;
  QPDFObjectHandle adbe;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined1 local_2b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_2a0 [2];
  uint local_27c;
  string local_278;
  undefined1 local_258 [40];
  Pipeline *local_230;
  ulong local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  uint local_174;
  long *local_170;
  void *local_168;
  long local_160 [2];
  QPDFObjectHandle local_150;
  undefined1 local_140 [32];
  undefined1 local_120 [16];
  QPDFObjGen local_110;
  QPDFObjGen local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  string local_f0;
  string local_d0;
  string local_b0;
  QPDFObjectHandle local_90;
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  
  indata = (uint *)CONCAT44(in_register_0000000c,flags);
  local_140._28_4_ = (undefined4)CONCAT71(in_register_00000089,compress);
  local_140._16_8_ = stream_length;
  QVar10 = QPDFObjectHandle::getObjGen(object);
  local_1b0 = (ulong)(uint)level;
  if (level < 0) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"invalid level in QPDFWriter::unparseObject");
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170," ","");
  if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      qdf_mode == true) {
    uVar28 = (int)local_1b0 * 2;
    indata = (uint *)(ulong)uVar28;
    stream_length = 0x20;
    std::__cxx11::string::_M_replace_aux((ulong)&local_170,(ulong)local_168,0,(char)uVar28);
    *(undefined1 *)local_170 = 10;
  }
  qVar7 = QPDFObjectHandle::getTypeCode(object);
  if (qVar7 - ot_string < 5) {
    uVar28 = flags & 0xfffffffe;
    indata = &switchD_001eb4c5::switchdataD_0027d8b4;
    switch(qVar7) {
    case ot_string:
      local_2d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2c8._M_allocated_capacity = local_2c8._M_allocated_capacity & 0xffffffffffffff00;
      local_2d8._M_allocated_capacity = (size_type)&local_2c8;
      if ((((flags & 0x14U) == 0) &&
          (peVar19 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr, peVar19->encrypted != false)) &&
         ((peVar19->cur_data_key)._M_string_length != 0)) {
        QPDFObjectHandle::getStringValue_abi_cxx11_((string *)local_258,object);
        std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,(string *)local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_258 + 0x10)) {
          operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
        }
        if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            encrypt_use_aes == true) {
          Pl_Buffer::Pl_Buffer((Pl_Buffer *)local_2b8,"encrypted string",(Pipeline *)0x0);
          key = QUtil::unsigned_char_pointer
                          (&((this->m).
                             super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->cur_data_key);
          indata = (uint *)0x1;
          Pl_AES_PDF::Pl_AES_PDF
                    ((Pl_AES_PDF *)local_258,"aes encrypt string",(Pipeline *)local_2b8,true,key,
                     (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->cur_data_key)._M_string_length);
          Pipeline::writeString((Pipeline *)local_258,(string *)&local_2d8);
          Pl_AES_PDF::finish((Pl_AES_PDF *)local_258);
          Pl_Buffer::getString_abi_cxx11_(&local_d0,(Pl_Buffer *)local_2b8);
          paVar24 = &local_d0.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p == paVar24) {
            local_188._8_8_ = local_d0.field_2._8_8_;
            local_198._M_allocated_capacity = (size_type)&local_188;
          }
          else {
            local_198._M_allocated_capacity = (size_type)local_d0._M_dataplus._M_p;
          }
          local_188._M_allocated_capacity._1_7_ = local_d0.field_2._M_allocated_capacity._1_7_;
          local_188._M_local_buf[0] = local_d0.field_2._M_local_buf[0];
          local_198._8_8_ = local_d0._M_string_length;
          local_d0._M_string_length = 0;
          local_d0.field_2._M_local_buf[0] = '\0';
          local_d0._M_dataplus._M_p = (pointer)paVar24;
          QPDF_String::unparse_abi_cxx11_(&local_278,(QPDF_String *)(local_1a8 + 0x10),true);
          std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,(string *)&local_278);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_allocated_capacity != &local_188) {
            operator_delete((void *)local_198._M_allocated_capacity,
                            local_188._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar24) {
            operator_delete(local_d0._M_dataplus._M_p,
                            CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                     local_d0.field_2._M_local_buf[0]) + 1);
          }
          Pl_AES_PDF::~Pl_AES_PDF((Pl_AES_PDF *)local_258);
          Pl_Buffer::~Pl_Buffer((Pl_Buffer *)local_2b8);
        }
        else {
          QUtil::make_unique_cstr((QUtil *)(local_1a8 + 0x10),(string *)&local_2d8);
          uVar33 = local_198._M_allocated_capacity;
          uVar32 = local_2d8._8_8_;
          key_00 = (RC4_KEY *)
                   QUtil::unsigned_char_pointer
                             (&((this->m).
                                super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->cur_data_key);
          uVar26 = (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->cur_data_key)._M_string_length;
          if ((uVar26 & 0xffffffff80000000) != 0) {
            QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar26);
          }
          RC4::RC4((RC4 *)&local_278,key_00,uVar26 & 0xffffffff,(uchar *)indata,
                   (uchar *)stream_length);
          indata = (uint *)QUtil::unsigned_char_pointer((char *)uVar33);
          RC4::process((RC4 *)&local_278,(uchar *)indata,uVar32,(uchar *)indata);
          local_110 = (QPDFObjGen)&local_100;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_120 + 0x10),uVar33,uVar32 + uVar33);
          if (local_110 == (QPDFObjGen)&local_100) {
            aaStack_2a0[0]._M_allocated_capacity = local_100._8_8_;
            local_2b8._0_8_ = (long)local_2b8 + 0x10;
          }
          else {
            local_2b8._0_4_ = local_110.obj;
            local_2b8._4_4_ = local_110.gen;
          }
          local_2b8._17_7_ = local_100._M_allocated_capacity._1_7_;
          local_2b8[0x10] = local_100._M_local_buf[0];
          local_2b8._8_4_ = local_108.obj;
          local_2b8._12_4_ = local_108.gen;
          local_108.obj = 0;
          local_108.gen = 0;
          local_100._M_local_buf[0] = '\0';
          local_110 = (QPDFObjGen)&local_100;
          QPDF_String::unparse_abi_cxx11_((string *)local_258,(QPDF_String *)local_2b8,false);
          std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,(string *)local_258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_258 + 0x10)) {
            operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
          }
          if (local_2b8._0_8_ != (long)local_2b8 + 0x10) {
            operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
          }
          if (local_110 != (QPDFObjGen)&local_100) {
            operator_delete((void *)local_110,
                            CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]
                                    ) + 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_allocated_capacity !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete__((void *)local_198._M_allocated_capacity);
          }
        }
      }
      else if ((flags & 8U) == 0) {
        QPDFObjectHandle::unparseResolved_abi_cxx11_((string *)local_258,object);
        std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,(string *)local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_258 + 0x10)) {
          operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
        }
      }
      else {
        QPDFObjectHandle::getStringValue_abi_cxx11_(&local_f0,object);
        QVar10 = (QPDFObjGen)&local_f0.field_2;
        if ((QPDFObjGen)local_f0._M_dataplus._M_p == QVar10) {
          aaStack_2a0[0]._M_allocated_capacity = local_f0.field_2._8_8_;
          local_2b8._0_8_ = (long)local_2b8 + 0x10;
        }
        else {
          local_2b8._0_8_ = local_f0._M_dataplus._M_p;
        }
        local_2b8._17_7_ = local_f0.field_2._M_allocated_capacity._1_7_;
        local_2b8[0x10] = local_f0.field_2._M_local_buf[0];
        local_2b8._8_8_ = local_f0._M_string_length;
        local_f0._M_string_length._0_4_ = 0;
        local_f0._M_string_length._4_4_ = 0;
        local_f0.field_2._M_local_buf[0] = '\0';
        local_f0._M_dataplus._M_p = (pointer)QVar10;
        QPDF_String::unparse_abi_cxx11_((string *)local_258,(QPDF_String *)local_2b8,true);
        std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,(string *)local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_258 + 0x10)) {
          operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
        }
        if (local_2b8._0_8_ != (long)local_2b8 + 0x10) {
          operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
        }
        if ((QPDFObjGen)local_f0._M_dataplus._M_p != QVar10) {
          operator_delete(local_f0._M_dataplus._M_p,
                          CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                   local_f0.field_2._M_local_buf[0]) + 1);
        }
      }
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_2d8._M_allocated_capacity,(void *)local_2d8._8_8_,
                 (size_t)indata);
      uVar32 = local_2c8._M_allocated_capacity;
      uVar33 = local_2d8._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_allocated_capacity == &local_2c8) goto LAB_001ed2fe;
      break;
    case ot_name:
      goto switchD_001eb4c5_caseD_7;
    case ot_array:
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x27de0c,(void *)0x1,0x27d8b4);
      local_258._0_8_ =
           (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_258._8_8_ =
           (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        object = (QPDFObjectHandle *)&__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_)->_M_use_count + 1;
        }
      }
      local_258._16_8_ = 0;
      iVar13 = ::qpdf::Array::begin((Array *)local_258);
      iVar14 = ::qpdf::Array::end((Array *)local_258);
      if (iVar13._M_current != iVar14._M_current) {
        local_1b0 = (ulong)((int)local_1b0 + 1);
        do {
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,(int)local_170,local_168,(size_t)object);
          peVar19 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          if (peVar19->qdf_mode == true) {
            ::qpdf::pl::Count::write(peVar19->pipeline,0x27c510,(void *)0x2,(size_t)object);
          }
          local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = ((iVar13._M_current)->super_BaseHandle).obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               ((iVar13._M_current)->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_50.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_50.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_50.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_50.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_50.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          object = (QPDFObjectHandle *)(ulong)uVar28;
          unparseChild(this,&local_50,(int)local_1b0,uVar28);
          if (local_50.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          iVar13._M_current = iVar13._M_current + 1;
        } while (iVar13._M_current != iVar14._M_current);
      }
      std::
      unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
      ::~unique_ptr((unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                     *)(local_258 + 0x10));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
      }
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_170,local_168,(size_t)object);
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x2696cc,(void *)0x1,(size_t)object);
      goto LAB_001ed2fe;
    case ot_dictionary:
      local_174 = uVar28;
      QPDFObjectHandle::unsafeShallowCopy((QPDFObjectHandle *)local_258);
      uVar33 = local_258._8_8_;
      uVar32 = local_258._0_8_;
      local_258._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_258._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (object->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar32;
      (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar33;
      if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
      }
      __n_00 = (QPDFObjGen)
               (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1a8._0_4_ = 0;
      local_1a8._4_4_ = 0;
      local_1a8._8_4_ = 0;
      local_1a8._12_4_ = 0;
      local_27c = flags;
      if ((*(int *)((long)__n_00 + 8) == QVar10.obj) && (*(int *)((long)__n_00 + 0xc) == QVar10.gen)
         ) {
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_258 + 0x10);
        local_258._0_8_ = paVar24;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/Extensions","");
        bVar5 = QPDFObjectHandle::hasKey(object,(string *)local_258);
        if (bVar5) {
          local_2b8._0_8_ = (long)local_2b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"/Extensions","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_2d8,(string *)object);
          bVar5 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_2d8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
          }
          if (local_2b8._0_8_ != (long)local_2b8 + 0x10) {
            operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
          }
        }
        else {
          bVar5 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._0_8_ != paVar24) {
          operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
        }
        if (bVar5 != false) {
          local_258._0_8_ = paVar24;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/Extensions","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)local_2b8,(string *)object);
          uVar32 = local_1a8._8_8_;
          local_1a8._8_8_ = local_2b8._8_8_;
          local_1a8._0_8_ = local_2b8._0_8_;
          local_2b8._0_4_ = 0;
          local_2b8._4_4_ = 0;
          local_2b8._8_4_ = 0;
          local_2b8._12_4_ = 0;
          if (((QPDFObjGen)uVar32 != (QPDFObjGen)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32),
             (QPDFObjGen)local_2b8._8_8_ != (QPDFObjGen)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._0_8_ != paVar24) {
            operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
          }
        }
        if ((QPDFObjGen)local_1a8._0_8_ == (QPDFObjGen)0x0) {
          bVar35 = false;
          bVar36 = false;
        }
        else {
          QPDFObjectHandle::getKeys_abi_cxx11_
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_258,(QPDFObjectHandle *)local_1a8);
          QVar10 = (QPDFObjGen)((long)local_2b8 + 0x10);
          local_2b8._0_8_ = QVar10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"/ADBE","");
          cVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_258,(key_type *)local_2b8);
          bVar35 = cVar12._M_node != (_Base_ptr)(local_258 + 8);
          if ((QPDFObjGen)local_2b8._0_8_ != QVar10) {
            operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
          }
          if (cVar12._M_node != (_Base_ptr)(local_258 + 8)) {
            local_2b8._0_8_ = QVar10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"/ADBE","");
            pVar37 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_258,(key_type *)local_2b8);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_258,(_Base_ptr)pVar37.first._M_node,
                           (_Base_ptr)pVar37.second._M_node);
            if ((QPDFObjGen)local_2b8._0_8_ != QVar10) {
              operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
            }
          }
          bVar36 = local_230 != (Pipeline *)0x0;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_258);
          flags = local_27c;
        }
        if (0 < ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->final_extension_level) {
          bVar5 = true;
          if (!bVar35 && !bVar36) {
            local_258._0_8_ = paVar24;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/Extensions","");
            QPDFObjectHandle::newDictionary();
            __n_00 = (QPDFObjGen)&local_2d8;
            QPDFObjectHandle::replaceKeyAndGetNew
                      ((QPDFObjectHandle *)local_2b8,(string *)object,(QPDFObjectHandle *)local_258)
            ;
            uVar32 = local_1a8._8_8_;
            local_1a8._8_8_ = local_2b8._8_8_;
            local_1a8._0_8_ = local_2b8._0_8_;
            local_2b8._0_4_ = 0;
            local_2b8._4_4_ = 0;
            local_2b8._8_4_ = 0;
            local_2b8._12_4_ = 0;
            if (((QPDFObjGen)uVar32 != (QPDFObjGen)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32),
               (QPDFObjGen)local_2b8._8_8_ != (QPDFObjGen)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._0_8_ != paVar24) {
              operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
            }
          }
          goto LAB_001ec01b;
        }
        if (bVar36 || !bVar35) {
LAB_001ec019:
          bVar5 = false;
          goto LAB_001ec01b;
        }
        local_258._0_8_ = paVar24;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/Extensions","");
        QPDFObjectHandle::removeKey(object,(string *)local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._0_8_ != paVar24) {
          operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
        }
        uVar32 = local_1a8._8_8_;
        local_1a8._0_4_ = 0;
        local_1a8._4_4_ = 0;
        local_1a8._8_4_ = 0;
        local_1a8._12_4_ = 0;
        if ((QPDFObjGen)uVar32 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32);
          goto LAB_001ec019;
        }
      }
      else {
        bVar5 = 0 < ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->final_extension_level;
LAB_001ec01b:
        if ((QPDFObjGen)local_1a8._0_8_ != (QPDFObjGen)0x0) {
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_258 + 0x10);
          local_258._0_8_ = paVar24;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/ADBE","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_140 + 0x20),(string *)local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._0_8_ != paVar24) {
            operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
          }
          bVar35 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_140 + 0x20));
          if (bVar35) {
            local_258._0_8_ = paVar24;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/BaseVersion","");
            QPDFObjectHandle::getKey
                      ((QPDFObjectHandle *)(local_1a8 + 0x10),(string *)(local_140 + 0x20));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2b8,"/",
                           &((this->m).
                             super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->final_pdf_version);
            bVar35 = QPDFObjectHandle::isNameAndEquals
                               ((QPDFObjectHandle *)(local_1a8 + 0x10),(string *)local_2b8);
            if (bVar35) {
              local_2d8._M_allocated_capacity = (size_type)&local_2c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2d8,"/ExtensionLevel","");
              QPDFObjectHandle::getKey(&local_150,(string *)(local_140 + 0x20));
              bVar35 = QPDFObjectHandle::isInteger(&local_150);
              if (bVar35) {
                local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_278,"/ExtensionLevel","");
                QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_b0,(string *)(local_140 + 0x20))
                ;
                QVar10 = (QPDFObjGen)QPDFObjectHandle::getIntValue((QPDFObjectHandle *)&local_b0);
                __n_00 = (QPDFObjGen)
                         (long)((this->m).
                                super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->final_extension_level;
                bVar35 = QVar10 == __n_00;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_b0._M_string_length);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_278._M_dataplus._M_p != &local_278.field_2) {
                  operator_delete(local_278._M_dataplus._M_p,
                                  local_278.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                bVar35 = false;
              }
              if (local_150.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_150.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._M_allocated_capacity != &local_2c8) {
                operator_delete((void *)local_2d8._M_allocated_capacity,
                                local_2c8._M_allocated_capacity + 1);
              }
            }
            else {
              bVar35 = false;
            }
            if (local_2b8._0_8_ != (long)local_2b8 + 0x10) {
              operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_258 + 0x10)) {
              operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
            }
            flags = local_27c;
            if (!bVar35) goto LAB_001ec40c;
          }
          else {
LAB_001ec40c:
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_258 + 0x10);
            local_258._0_8_ = paVar24;
            if (bVar5) {
              std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/ADBE","");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_1a8 + 0x10),"<< /BaseVersion /",
                             &((this->m).
                               super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->final_pdf_version);
              plVar15 = (long *)std::__cxx11::string::append(local_1a8 + 0x10);
              paVar24 = &local_278.field_2;
              paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar15 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar15 == paVar25) {
                local_278.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
                local_278.field_2._8_8_ = plVar15[3];
                local_278._M_dataplus._M_p = (pointer)paVar24;
              }
              else {
                local_278.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
                local_278._M_dataplus._M_p = (pointer)*plVar15;
              }
              local_278._M_string_length = plVar15[1];
              *plVar15 = (long)paVar25;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              uVar28 = ((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->final_extension_level;
              uVar2 = -uVar28;
              if (0 < (int)uVar28) {
                uVar2 = uVar28;
              }
              uVar29 = 1;
              if (9 < uVar2) {
                uVar26 = (ulong)uVar2;
                uVar3 = 4;
                do {
                  uVar29 = uVar3;
                  uVar23 = (uint)uVar26;
                  if (uVar23 < 100) {
                    uVar29 = uVar29 - 2;
                    goto LAB_001ed33c;
                  }
                  if (uVar23 < 1000) {
                    uVar29 = uVar29 - 1;
                    goto LAB_001ed33c;
                  }
                  if (uVar23 < 10000) goto LAB_001ed33c;
                  uVar26 = uVar26 / 10000;
                  uVar3 = uVar29 + 4;
                } while (99999 < uVar23);
                uVar29 = uVar29 + 1;
              }
LAB_001ed33c:
              local_150.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_140;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_150,(char)uVar29 - (char)((int)uVar28 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)((long)&((local_150.super_BaseHandle.obj.
                                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->value).
                                         super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                         .
                                         super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                         .
                                         super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                         .
                                         super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                         .
                                         super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                         .
                                         super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 + (ulong)(uVar28 >> 0x1f)),uVar29,uVar2);
              uVar26 = (long)(_func_int ***)local_278._M_string_length +
                       (long)&(local_150.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base;
              uVar32 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._M_dataplus._M_p != paVar24) {
                uVar32 = local_278.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar32 < uVar26) {
                uVar31 = 0xf;
                if (local_150.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)local_140) {
                  uVar31 = local_140._0_8_;
                }
                if (uVar31 < uVar26) goto LAB_001ed3cb;
                puVar20 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_150,0,(char *)0x0,
                                     (ulong)local_278._M_dataplus._M_p);
              }
              else {
LAB_001ed3cb:
                puVar20 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_278,
                                     (ulong)local_150.super_BaseHandle.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr);
              }
              local_2d8._M_allocated_capacity = (size_type)&local_2c8;
              paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar20 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar20 == paVar25) {
                local_2c8._M_allocated_capacity = paVar25->_M_allocated_capacity;
                local_2c8._8_8_ = puVar20[3];
              }
              else {
                local_2c8._M_allocated_capacity = paVar25->_M_allocated_capacity;
                local_2d8._M_allocated_capacity =
                     (size_type)
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar20;
              }
              local_2d8._8_8_ = puVar20[1];
              *puVar20 = paVar25;
              puVar20[1] = 0;
              paVar25->_M_local_buf[0] = '\0';
              pQVar21 = (QPDFObjGen *)std::__cxx11::string::append(local_2d8._M_local_buf);
              __n_00 = (QPDFObjGen)(pQVar21 + 2);
              if (*pQVar21 == __n_00) {
                local_2b8._16_8_ = *(undefined8 *)__n_00;
                aaStack_2a0[0]._0_8_ = pQVar21[3];
                local_2b8._0_8_ = (long)local_2b8 + 0x10;
              }
              else {
                local_2b8._16_8_ = *(undefined8 *)__n_00;
                local_2b8._0_8_ = *pQVar21;
              }
              local_2b8._8_8_ = pQVar21[1];
              *pQVar21 = __n_00;
              pQVar21[1].obj = 0;
              pQVar21[1].gen = 0;
              *(undefined1 *)&pQVar21[2].obj = 0;
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
              QPDFObjectHandle::parse(&local_40,(string *)local_2b8,&local_b0);
              QPDFObjectHandle::replaceKey
                        ((QPDFObjectHandle *)local_1a8,(string *)local_258,&local_40);
              if (local_40.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_40.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_2b8._0_8_ != (long)local_2b8 + 0x10) {
                operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._M_allocated_capacity != &local_2c8) {
                operator_delete((void *)local_2d8._M_allocated_capacity,
                                local_2c8._M_allocated_capacity + 1);
              }
              if (local_150.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)local_140) {
                operator_delete(local_150.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                                local_140._0_8_ + 1);
              }
              flags = local_27c;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._M_dataplus._M_p != paVar24) {
                operator_delete(local_278._M_dataplus._M_p,
                                local_278.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_allocated_capacity != &local_188) {
                operator_delete((void *)local_198._M_allocated_capacity,
                                local_188._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._0_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_258 + 0x10)) goto LAB_001ec4e6;
            }
            else {
              std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/ADBE","");
              QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_1a8,(string *)local_258);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._0_8_ == paVar24) goto LAB_001ec4e6;
            }
            operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
          }
LAB_001ec4e6:
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_);
          }
        }
      }
      if ((flags & 1U) != 0) {
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_258 + 0x10);
        local_258._0_8_ = paVar24;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/Length","");
        QPDFObjectHandle::removeKey(object,(string *)local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._0_8_ != paVar24) {
          operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
        }
        local_258._0_8_ = paVar24;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/DecodeParms","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_2d8,(string *)object);
        bVar5 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&local_2d8);
        if (bVar5) {
          local_2b8._0_8_ = (long)local_2b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"/DecodeParms","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_278,(string *)object);
          iVar8 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)&local_278);
          bVar5 = iVar8 == 0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length);
          }
          if (local_2b8._0_8_ != (long)local_2b8 + 0x10) {
            operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
          }
        }
        else {
          bVar5 = false;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._0_8_ != paVar24) {
          operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
        }
        if (bVar5) {
          local_258._0_8_ = paVar24;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/DecodeParms","");
          QPDFObjectHandle::removeKey(object,(string *)local_258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._0_8_ != paVar24) {
            operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
          }
        }
        if ((flags & 2U) == 0) {
          local_258._0_8_ = paVar24;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/Filter","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)local_2b8,(string *)object);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._0_8_ != paVar24) {
            operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
          }
          local_258._0_8_ = paVar24;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/DecodeParms","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_2d8,(string *)object);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._0_8_ != paVar24) {
            operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
          }
          local_258._0_8_ = paVar24;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/Crypt","");
          bVar5 = QPDFObjectHandle::isOrHasName((QPDFObjectHandle *)local_2b8,(string *)local_258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._0_8_ != paVar24) {
            operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
          }
          if (bVar5) {
            bVar5 = QPDFObjectHandle::isName((QPDFObjectHandle *)local_2b8);
            if (bVar5) {
              local_258._0_8_ = paVar24;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/Filter","");
              QPDFObjectHandle::removeKey(object,(string *)local_258);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._0_8_ != paVar24) {
                operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
              }
              local_258._0_8_ = paVar24;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/DecodeParms","")
              ;
              QPDFObjectHandle::removeKey(object,(string *)local_258);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._0_8_ != paVar24) {
                operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
              }
            }
            else {
              for (iVar8 = 0;
                  iVar9 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_2b8),
                  iVar8 < iVar9; iVar8 = iVar8 + 1) {
                QPDFObjectHandle::getArrayItem
                          ((QPDFObjectHandle *)&local_278,(int)(QPDFObjectHandle *)local_2b8);
                local_258._0_8_ = paVar24;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/Crypt","");
                bVar5 = QPDFObjectHandle::isNameAndEquals
                                  ((QPDFObjectHandle *)&local_278,(string *)local_258);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._0_8_ != paVar24) {
                  operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_278._M_string_length);
                }
                if (bVar5) {
                  QPDFObjectHandle::eraseItem((QPDFObjectHandle *)local_2b8,iVar8);
                  QPDFObjectHandle::eraseItem((QPDFObjectHandle *)&local_2d8,iVar8);
                  break;
                }
              }
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
          }
          if ((QPDFObjGen)local_2b8._8_8_ != (QPDFObjGen)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
          }
        }
        else {
          local_258._0_8_ = paVar24;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/Filter","");
          QPDFObjectHandle::removeKey(object,(string *)local_258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._0_8_ != paVar24) {
            operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
          }
          local_258._0_8_ = paVar24;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/DecodeParms","");
          QPDFObjectHandle::removeKey(object,(string *)local_258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._0_8_ != paVar24) {
            operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
          }
        }
      }
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x27ddf4,(void *)0x2,(size_t)__n_00);
      local_278._M_dataplus._M_p =
           (pointer)(object->super_BaseHandle).obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_278._M_string_length =
           (size_type)
           (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      __n_01 = object;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        __n_01 = (QPDFObjectHandle *)&__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length)->
                 _M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length)->
                 _M_use_count + 1;
        }
      }
      pQVar16 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)&local_278);
      if (pQVar16 == (QPDF_Dictionary *)0x0) {
        p_Var18 = (_Base_ptr)0x0;
      }
      else {
        p_Var18 = (pQVar16->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      pQVar16 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)&local_278);
      p_Var34 = &(pQVar16->items)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar16 == (QPDF_Dictionary *)0x0) {
        p_Var34 = (_Base_ptr)0x0;
      }
      if (p_Var18 != p_Var34) {
        local_1b0 = (ulong)((int)local_1b0 + 1);
        uVar28 = local_174 | 0x18;
        do {
          __v = *(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  **)(p_Var18 + 2);
          if (__v != (variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      *)0x0) {
            _Var6 = (__v->
                    super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ).
                    super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ._M_index;
            if (_Var6 == '\x0f') {
              pvVar17 = std::
                        get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                                  (__v);
LAB_001ecd0d:
              _Var6 = *(__index_type *)
                       ((long)&(((pvVar17->obj).
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                               ->value).
                               super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       + 0x30);
            }
            else if (_Var6 == '\r') {
              pvVar17 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                         *)QPDF::resolve(*(QPDF **)((long)&__v[1].
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  ._M_u + 0x10),
                                         *(QPDFObjGen *)
                                          ((long)&__v[1].
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  ._M_u + 0x18));
              goto LAB_001ecd0d;
            }
            if (_Var6 != '\x02') {
              ::qpdf::pl::Count::write
                        (((this->m).
                          super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->pipeline,(int)local_170,local_168,(size_t)__n_01);
              peVar19 = (this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (peVar19->qdf_mode == true) {
                ::qpdf::pl::Count::write(peVar19->pipeline,0x27c510,(void *)0x2,(size_t)__n_01);
              }
              ::qpdf::Name::normalize((string *)local_258,(string *)(p_Var18 + 1));
              ::qpdf::pl::Count::write
                        (((this->m).
                          super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->pipeline,(int)local_258._0_8_,(void *)local_258._8_8_,(size_t)__n_01);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_258 + 0x10)) {
                operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
              }
              ::qpdf::pl::Count::write
                        (((this->m).
                          super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->pipeline,0x27e056,(void *)0x1,(size_t)__n_01);
              iVar8 = std::__cxx11::string::compare((char *)(p_Var18 + 1));
              if (iVar8 == 0) {
                local_258._0_8_ = local_258 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/Sig","");
                local_2b8._0_8_ = (long)local_2b8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"");
                bVar5 = QPDFObjectHandle::isDictionaryOfType
                                  (object,(string *)local_258,(string *)local_2b8);
                if (bVar5) {
                  local_2d8._M_allocated_capacity = (size_type)&local_2c8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2d8,"/ByteRange","");
                  bVar5 = QPDFObjectHandle::hasKey(object,(string *)&local_2d8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d8._M_allocated_capacity != &local_2c8) {
                    operator_delete((void *)local_2d8._M_allocated_capacity,
                                    local_2c8._M_allocated_capacity + 1);
                  }
                }
                else {
                  bVar5 = false;
                }
                if (local_2b8._0_8_ != (long)local_2b8 + 0x10) {
                  operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_258 + 0x10)) {
                  operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
                }
                if (bVar5 == false) goto LAB_001ecf17;
                local_60.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     *(element_type **)(p_Var18 + 2);
                local_60.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var18[2]._M_parent;
                if ((_Base_ptr)
                    local_60.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Base_ptr)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&((_Base_ptr)
                             local_60.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_M_parent =
                         *(int *)&((_Base_ptr)
                                  local_60.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_parent + 1;
                    UNLOCK();
                  }
                  else {
                    *(int *)&((_Base_ptr)
                             local_60.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_M_parent =
                         *(int *)&((_Base_ptr)
                                  local_60.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_parent + 1;
                  }
                }
                __n_01 = (QPDFObjectHandle *)(ulong)uVar28;
                unparseChild(this,&local_60,(int)local_1b0,uVar28);
                this_02._M_pi =
                     local_60.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              }
              else {
LAB_001ecf17:
                local_70.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     *(element_type **)(p_Var18 + 2);
                local_70.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var18[2]._M_parent;
                if ((_Base_ptr)
                    local_70.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Base_ptr)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&((_Base_ptr)
                             local_70.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_M_parent =
                         *(int *)&((_Base_ptr)
                                  local_70.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_parent + 1;
                    UNLOCK();
                  }
                  else {
                    *(int *)&((_Base_ptr)
                             local_70.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_M_parent =
                         *(int *)&((_Base_ptr)
                                  local_70.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_parent + 1;
                  }
                }
                __n_01 = (QPDFObjectHandle *)(ulong)local_174;
                unparseChild(this,&local_70,(int)local_1b0,local_174);
                this_02._M_pi =
                     local_70.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              }
              if ((_Base_ptr)this_02._M_pi != (_Base_ptr)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
              }
            }
          }
          p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
        } while (p_Var18 != p_Var34);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length);
      }
      uVar28 = local_27c;
      if ((local_27c & 1) != 0) {
        ::qpdf::pl::Count::write
                  (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->pipeline,(int)local_170,local_168,(size_t)__n_01);
        peVar19 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        if (peVar19->qdf_mode == true) {
          ::qpdf::pl::Count::write(peVar19->pipeline,0x27c510,(void *)0x2,(size_t)__n_01);
          peVar19 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
        }
        ::qpdf::pl::Count::write(peVar19->pipeline,0x27da59,(void *)0x8,(size_t)__n_01);
        peVar19 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        if (peVar19->direct_stream_lengths == true) {
          cVar30 = '\x01';
          if ((QPDFObjectHandle *)0x9 < (ulong)local_140._16_8_) {
            __n_01 = (QPDFObjectHandle *)local_140._16_8_;
            cVar4 = '\x04';
            do {
              cVar30 = cVar4;
              if (__n_01 < (QPDFObjectHandle *)0x64) {
                cVar30 = cVar30 + -2;
                goto LAB_001ed126;
              }
              if (__n_01 < (QPDFObjectHandle *)0x3e8) {
                cVar30 = cVar30 + -1;
                goto LAB_001ed126;
              }
              if (__n_01 < (QPDFObjectHandle *)0x2710) goto LAB_001ed126;
              pQVar27 = (QPDFObjectHandle *)((ulong)__n_01 / 10000);
              bVar5 = (QPDFObjectHandle *)0x1869f < __n_01;
              __n_01 = pQVar27;
              cVar4 = cVar30 + '\x04';
            } while (bVar5);
            cVar30 = cVar30 + '\x01';
          }
LAB_001ed126:
          local_258._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_258 + 0x10);
          std::__cxx11::string::_M_construct((ulong)local_258,cVar30);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_258._0_8_,local_258._8_4_,local_140._16_8_);
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,(int)local_258._0_8_,(void *)local_258._8_8_,(size_t)__n_01);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_258 + 0x10)) {
            operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
          }
        }
        else {
          uVar28 = peVar19->cur_stream_length_id;
          uVar2 = -uVar28;
          if (0 < (int)uVar28) {
            uVar2 = uVar28;
          }
          uVar29 = 1;
          if (9 < uVar2) {
            __n_01 = (QPDFObjectHandle *)(ulong)uVar2;
            uVar3 = 4;
            do {
              uVar29 = uVar3;
              uVar23 = (uint)__n_01;
              if (uVar23 < 100) {
                uVar29 = uVar29 - 2;
                goto LAB_001ed1a7;
              }
              if (uVar23 < 1000) {
                uVar29 = uVar29 - 1;
                goto LAB_001ed1a7;
              }
              if (uVar23 < 10000) goto LAB_001ed1a7;
              __n_01 = (QPDFObjectHandle *)((ulong)__n_01 / 10000);
              uVar3 = uVar29 + 4;
            } while (99999 < uVar23);
            uVar29 = uVar29 + 1;
          }
LAB_001ed1a7:
          local_258._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_258 + 0x10);
          std::__cxx11::string::_M_construct
                    ((ulong)local_258,(char)uVar29 - (char)((int)uVar28 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)(local_258._0_8_ + (ulong)(uVar28 >> 0x1f)),uVar29,uVar2);
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,(int)local_258._0_8_,(void *)local_258._8_8_,(size_t)__n_01);
          uVar28 = local_27c;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_258 + 0x10)) {
            operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
          }
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,0x27fb8c,(void *)0x4,(size_t)__n_01);
        }
        bVar22 = (byte)local_140._28_4_ ^ 1 | (uVar28 & 2) == 0;
        __n_01 = (QPDFObjectHandle *)(ulong)CONCAT31(SUB43(local_140._28_4_,1),bVar22);
        if (bVar22 == 0) {
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,(int)local_170,local_168,(size_t)__n_01);
          peVar19 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          if (peVar19->qdf_mode == true) {
            ::qpdf::pl::Count::write(peVar19->pipeline,0x27c510,(void *)0x2,(size_t)__n_01);
            peVar19 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
          }
          ::qpdf::pl::Count::write(peVar19->pipeline,0x27e068,(void *)0x14,(size_t)__n_01);
        }
      }
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_170,local_168,(size_t)__n_01);
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x27e257,(void *)0x2,(size_t)__n_01);
      if ((QPDFObjGen)local_1a8._8_8_ != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
      }
      goto LAB_001ed2fe;
    case ot_stream:
      peVar19 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if (peVar19->direct_stream_lengths == false) {
        uVar31 = (ulong)QVar10.obj;
        lVar1 = *(long *)&(peVar19->obj).super_ObjTable<QPDFWriter::Object>.
                          super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                          super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                          ._M_impl;
        uVar26 = ((long)*(pointer *)
                         ((long)&(peVar19->obj).super_ObjTable<QPDFWriter::Object>.
                                 super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                 .
                                 super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                         + 8) - lVar1 >> 2) * -0x5555555555555555;
        if (uVar26 < uVar31 || uVar26 - uVar31 == 0) {
          pOVar11 = ObjTable<QPDFWriter::Object>::large_element
                              (&(peVar19->obj).super_ObjTable<QPDFWriter::Object>,uVar31);
          peVar19 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
        }
        else {
          pOVar11 = (Object *)(lVar1 + uVar31 * 0xc);
        }
        peVar19->cur_stream_length_id = pOVar11->renumber + 1;
      }
      local_278._M_dataplus._M_p = local_278._M_dataplus._M_p & 0xffffffffffffff00;
      local_198._M_allocated_capacity = local_198._M_allocated_capacity & 0xffffffffffffff00;
      local_258._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_258._16_8_ = local_258._16_8_ & 0xffffffffffffff00;
      local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (object->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_80.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_80.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      local_258._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_258 + 0x10);
      bVar5 = willFilterStream(this,&local_80,(bool *)&local_278,(bool *)(local_1a8 + 0x10),
                               (string *)local_258);
      if (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      QPDFObjectHandle::getDict((QPDFObjectHandle *)local_2b8);
      peVar19 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      peVar19->cur_stream_length = local_258._8_8_;
      if (((local_198._M_local_buf[0] == '\x01') && (peVar19->encrypted == true)) &&
         (peVar19->encrypt_metadata == false)) {
        (peVar19->cur_data_key)._M_string_length = 0;
        *(peVar19->cur_data_key)._M_dataplus._M_p = '\0';
        peVar19 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      }
      if (((peVar19->encrypted == true) && ((peVar19->cur_data_key)._M_string_length != 0)) &&
         (peVar19->encrypt_use_aes == true)) {
        peVar19->cur_stream_length = (peVar19->cur_stream_length & 0xfffffffffffffff0) + 0x20;
      }
      uVar28 = (uint)bVar5 * 2 | flags | 1;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(ulong)uVar28;
      local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_2b8._0_8_;
      local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_;
      if ((QPDFObjGen)local_2b8._8_8_ != (QPDFObjGen)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_2b8._8_8_ + 8) = *(_Atomic_word *)(local_2b8._8_8_ + 8) + 1;
          UNLOCK();
          peVar19 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
        }
        else {
          *(_Atomic_word *)(local_2b8._8_8_ + 8) = *(_Atomic_word *)(local_2b8._8_8_ + 8) + 1;
        }
      }
      unparseObject(this,&local_90,0,uVar28,peVar19->cur_stream_length,
                    local_278._M_dataplus._M_p._0_1_);
      if ((QPDFObjGen)
          local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar5 = true;
      }
      else {
        bVar5 = ((char *)(local_258._0_8_ + -1))[local_258._8_8_] != '\n';
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._0_8_;
      }
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x27e1d6,(void *)0x8,(size_t)paVar24);
      local_2d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2d8._M_allocated_capacity = (size_type)this;
      pushEncryptionFilter(this,(PipelinePopper *)&local_2d8);
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_258._0_8_,(void *)local_258._8_8_,(size_t)paVar24);
      PipelinePopper::~PipelinePopper((PipelinePopper *)&local_2d8);
      peVar19 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if ((peVar19->newline_before_endstream == false) && ((bVar5 & peVar19->qdf_mode) != 1)) {
        __n = 0;
      }
      else {
        ::qpdf::pl::Count::write(peVar19->pipeline,0x27e1b7,(void *)0x1,(size_t)paVar24);
        peVar19 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        __n = CONCAT71((int7)((ulong)paVar24 >> 8),1);
      }
      peVar19->added_newline = SUB81(__n,0);
      ::qpdf::pl::Count::write(peVar19->pipeline,0x27e26f,(void *)0x9,__n);
      if ((QPDFObjGen)local_2b8._8_8_ != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
      }
      uVar32 = local_258._16_8_;
      uVar33 = local_258._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_258 + 0x10)) goto LAB_001ed2fe;
    }
  }
  else {
switchD_001eb4c5_caseD_7:
    QPDFObjectHandle::unparseResolved_abi_cxx11_((string *)local_258,object);
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,(int)local_258._0_8_,(void *)local_258._8_8_,(size_t)indata);
    uVar32 = local_258._16_8_;
    uVar33 = local_258._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_258 + 0x10)) goto LAB_001ed2fe;
  }
  operator_delete((void *)uVar33,uVar32 + 1);
LAB_001ed2fe:
  if (local_170 != local_160) {
    operator_delete(local_170,local_160[0] + 1);
  }
  return;
}

Assistant:

void
QPDFWriter::unparseObject(
    QPDFObjectHandle object, int level, int flags, size_t stream_length, bool compress)
{
    QPDFObjGen old_og = object.getObjGen();
    int child_flags = flags & ~f_stream;
    if (level < 0) {
        throw std::logic_error("invalid level in QPDFWriter::unparseObject");
    }
    // For non-qdf, "indent" is a single space between tokens. For qdf, indent includes the
    // preceding newline.
    std::string indent = " ";
    if (m->qdf_mode) {
        indent.append(static_cast<size_t>(2 * level), ' ');
        indent[0] = '\n';
    }

    if (auto const tc = object.getTypeCode(); tc == ::ot_array) {
        // Note: PDF spec 1.4 implementation note 121 states that Acrobat requires a space after the
        // [ in the /H key of the linearization parameter dictionary.  We'll do this unconditionally
        // for all arrays because it looks nicer and doesn't make the files that much bigger.
        writeString("[");
        for (auto const& item: object.as_array()) {
            writeString(indent);
            writeStringQDF("  ");
            unparseChild(item, level + 1, child_flags);
        }
        writeString(indent);
        writeString("]");
    } else if (tc == ::ot_dictionary) {
        // Make a shallow copy of this object so we can modify it safely without affecting the
        // original. This code has logic to skip certain keys in agreement with prepareFileForWrite
        // and with skip_stream_parameters so that replacing them doesn't leave unreferenced objects
        // in the output. We can use unsafeShallowCopy here because all we are doing is removing or
        // replacing top-level keys.
        object = object.unsafeShallowCopy();

        // Handle special cases for specific dictionaries.

        // Extensions dictionaries.

        // We have one of several cases:
        //
        // * We need ADBE
        //    - We already have Extensions
        //       - If it has the right ADBE, preserve it
        //       - Otherwise, replace ADBE
        //    - We don't have Extensions: create one from scratch
        // * We don't want ADBE
        //    - We already have Extensions
        //       - If it only has ADBE, remove it
        //       - If it has other things, keep those and remove ADBE
        //    - We have no extensions: no action required
        //
        // Before writing, we guarantee that /Extensions, if present, is direct through the ADBE
        // dictionary, so we can modify in place.

        const bool is_root = (old_og == m->root_og);
        bool have_extensions_other = false;
        bool have_extensions_adbe = false;

        QPDFObjectHandle extensions;
        if (is_root) {
            if (object.hasKey("/Extensions") && object.getKey("/Extensions").isDictionary()) {
                extensions = object.getKey("/Extensions");
            }
        }

        if (extensions) {
            std::set<std::string> keys = extensions.getKeys();
            if (keys.count("/ADBE") > 0) {
                have_extensions_adbe = true;
                keys.erase("/ADBE");
            }
            if (keys.size() > 0) {
                have_extensions_other = true;
            }
        }

        bool need_extensions_adbe = (m->final_extension_level > 0);

        if (is_root) {
            if (need_extensions_adbe) {
                if (!(have_extensions_other || have_extensions_adbe)) {
                    // We need Extensions and don't have it.  Create it here.
                    QTC::TC("qpdf", "QPDFWriter create Extensions", m->qdf_mode ? 0 : 1);
                    extensions = object.replaceKeyAndGetNew(
                        "/Extensions", QPDFObjectHandle::newDictionary());
                }
            } else if (!have_extensions_other) {
                // We have Extensions dictionary and don't want one.
                if (have_extensions_adbe) {
                    QTC::TC("qpdf", "QPDFWriter remove existing Extensions");
                    object.removeKey("/Extensions");
                    extensions = QPDFObjectHandle(); // uninitialized
                }
            }
        }

        if (extensions) {
            QTC::TC("qpdf", "QPDFWriter preserve Extensions");
            QPDFObjectHandle adbe = extensions.getKey("/ADBE");
            if (adbe.isDictionary() &&
                adbe.getKey("/BaseVersion").isNameAndEquals("/" + m->final_pdf_version) &&
                adbe.getKey("/ExtensionLevel").isInteger() &&
                (adbe.getKey("/ExtensionLevel").getIntValue() == m->final_extension_level)) {
                QTC::TC("qpdf", "QPDFWriter preserve ADBE");
            } else {
                if (need_extensions_adbe) {
                    extensions.replaceKey(
                        "/ADBE",
                        QPDFObjectHandle::parse(
                            "<< /BaseVersion /" + m->final_pdf_version + " /ExtensionLevel " +
                            std::to_string(m->final_extension_level) + " >>"));
                } else {
                    QTC::TC("qpdf", "QPDFWriter remove ADBE");
                    extensions.removeKey("/ADBE");
                }
            }
        }

        // Stream dictionaries.

        if (flags & f_stream) {
            // Suppress /Length since we will write it manually
            object.removeKey("/Length");

            // If /DecodeParms is an empty list, remove it.
            if (object.getKey("/DecodeParms").isArray() &&
                (0 == object.getKey("/DecodeParms").getArrayNItems())) {
                QTC::TC("qpdf", "QPDFWriter remove empty DecodeParms");
                object.removeKey("/DecodeParms");
            }

            if (flags & f_filtered) {
                // We will supply our own filter and decode
                // parameters.
                object.removeKey("/Filter");
                object.removeKey("/DecodeParms");
            } else {
                // Make sure, no matter what else we have, that we don't have /Crypt in the output
                // filters.
                QPDFObjectHandle filter = object.getKey("/Filter");
                QPDFObjectHandle decode_parms = object.getKey("/DecodeParms");
                if (filter.isOrHasName("/Crypt")) {
                    if (filter.isName()) {
                        object.removeKey("/Filter");
                        object.removeKey("/DecodeParms");
                    } else {
                        int idx = -1;
                        for (int i = 0; i < filter.getArrayNItems(); ++i) {
                            QPDFObjectHandle item = filter.getArrayItem(i);
                            if (item.isNameAndEquals("/Crypt")) {
                                idx = i;
                                break;
                            }
                        }
                        if (idx >= 0) {
                            // If filter is an array, then the code in QPDF_Stream has already
                            // verified that DecodeParms and Filters are arrays of the same length,
                            // but if they weren't for some reason, eraseItem does type and bounds
                            // checking.
                            QTC::TC("qpdf", "QPDFWriter remove Crypt");
                            filter.eraseItem(idx);
                            decode_parms.eraseItem(idx);
                        }
                    }
                }
            }
        }

        writeString("<<");

        for (auto const& [key, value]: object.as_dictionary()) {
            if (!value.null()) {
                writeString(indent);
                writeStringQDF("  ");
                writeString(Name::normalize(key));
                writeString(" ");
                if (key == "/Contents" && object.isDictionaryOfType("/Sig") &&
                    object.hasKey("/ByteRange")) {
                    QTC::TC("qpdf", "QPDFWriter no encryption sig contents");
                    unparseChild(value, level + 1, child_flags | f_hex_string | f_no_encryption);
                } else {
                    unparseChild(value, level + 1, child_flags);
                }
            }
        }

        if (flags & f_stream) {
            writeString(indent);
            writeStringQDF("  ");
            writeString("/Length ");

            if (m->direct_stream_lengths) {
                writeString(std::to_string(stream_length));
            } else {
                writeString(std::to_string(m->cur_stream_length_id));
                writeString(" 0 R");
            }
            if (compress && (flags & f_filtered)) {
                writeString(indent);
                writeStringQDF("  ");
                writeString("/Filter /FlateDecode");
            }
        }

        writeString(indent);
        writeString(">>");
    } else if (tc == ::ot_stream) {
        // Write stream data to a buffer.
        if (!m->direct_stream_lengths) {
            m->cur_stream_length_id = m->obj[old_og].renumber + 1;
        }

        flags |= f_stream;
        bool compress_stream = false;
        bool is_metadata = false;
        std::string stream_data;
        if (willFilterStream(object, compress_stream, is_metadata, &stream_data)) {
            flags |= f_filtered;
        }
        QPDFObjectHandle stream_dict = object.getDict();

        m->cur_stream_length = stream_data.size();
        if (is_metadata && m->encrypted && (!m->encrypt_metadata)) {
            // Don't encrypt stream data for the metadata stream
            m->cur_data_key.clear();
        }
        adjustAESStreamLength(m->cur_stream_length);
        unparseObject(stream_dict, 0, flags, m->cur_stream_length, compress_stream);
        char last_char = stream_data.empty() ? '\0' : stream_data.back();
        writeString("\nstream\n");
        {
            PipelinePopper pp_enc(this);
            pushEncryptionFilter(pp_enc);
            writeString(stream_data);
        }

        if (m->newline_before_endstream || (m->qdf_mode && last_char != '\n')) {
            writeString("\n");
            m->added_newline = true;
        } else {
            m->added_newline = false;
        }
        writeString("endstream");
    } else if (tc == ::ot_string) {
        std::string val;
        if (m->encrypted && (!(flags & f_in_ostream)) && (!(flags & f_no_encryption)) &&
            (!m->cur_data_key.empty())) {
            val = object.getStringValue();
            if (m->encrypt_use_aes) {
                Pl_Buffer bufpl("encrypted string");
                Pl_AES_PDF pl(
                    "aes encrypt string",
                    &bufpl,
                    true,
                    QUtil::unsigned_char_pointer(m->cur_data_key),
                    m->cur_data_key.length());
                pl.writeString(val);
                pl.finish();
                val = QPDF_String(bufpl.getString()).unparse(true);
            } else {
                auto tmp_ph = QUtil::make_unique_cstr(val);
                char* tmp = tmp_ph.get();
                size_t vlen = val.length();
                RC4 rc4(
                    QUtil::unsigned_char_pointer(m->cur_data_key),
                    QIntC::to_int(m->cur_data_key.length()));
                auto data = QUtil::unsigned_char_pointer(tmp);
                rc4.process(data, vlen, data);
                val = QPDF_String(std::string(tmp, vlen)).unparse();
            }
        } else if (flags & f_hex_string) {
            val = QPDF_String(object.getStringValue()).unparse(true);
        } else {
            val = object.unparseResolved();
        }
        writeString(val);
    } else {
        writeString(object.unparseResolved());
    }
}